

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_sndio.c
# Opt level: O0

int sndio_enumerate_devices
              (cubeb_conflict2 *context,cubeb_device_type type,cubeb_device_collection *collection)

{
  undefined8 *puVar1;
  undefined8 *in_RDX;
  undefined4 in_ESI;
  cubeb_device_info *device;
  int local_4;
  
  puVar1 = (undefined8 *)malloc(0x58);
  if (puVar1 == (undefined8 *)0x0) {
    local_4 = -1;
  }
  else {
    *puVar1 = sndio_enumerate_devices::dev;
    puVar1[1] = sndio_enumerate_devices::dev;
    puVar1[2] = sndio_enumerate_devices::dev;
    puVar1[3] = sndio_enumerate_devices::dev;
    puVar1[4] = 0;
    *(undefined4 *)(puVar1 + 5) = in_ESI;
    *(undefined4 *)((long)puVar1 + 0x2c) = 2;
    *(undefined4 *)(puVar1 + 6) = 0xf;
    *(undefined4 *)((long)puVar1 + 0x34) = 0x10;
    *(undefined4 *)(puVar1 + 7) = 0x10;
    *(undefined4 *)((long)puVar1 + 0x3c) = 0x10;
    *(undefined4 *)(puVar1 + 8) = 48000;
    *(undefined4 *)(puVar1 + 9) = 4000;
    *(undefined4 *)((long)puVar1 + 0x44) = 0x2ee00;
    *(undefined4 *)((long)puVar1 + 0x4c) = 0x1e0;
    *(undefined4 *)(puVar1 + 10) = 0x2580;
    *in_RDX = puVar1;
    in_RDX[1] = 1;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
sndio_enumerate_devices(cubeb *context, cubeb_device_type type,
	cubeb_device_collection *collection)
{
  static char dev[] = SIO_DEVANY;
  cubeb_device_info *device;

  device = malloc(sizeof(cubeb_device_info));
  if (device == NULL)
    return CUBEB_ERROR;

  device->devid = dev;		/* passed to stream_init() */
  device->device_id = dev;	/* printable in UI */
  device->friendly_name = dev;	/* same, but friendly */
  device->group_id = dev;	/* actual device if full-duplex */
  device->vendor_name = NULL;   /* may be NULL */
  device->type = type;		/* Input/Output */
  device->state = CUBEB_DEVICE_STATE_ENABLED;
  device->preferred = CUBEB_DEVICE_PREF_ALL;
  device->format = CUBEB_DEVICE_FMT_S16NE;
  device->default_format = CUBEB_DEVICE_FMT_S16NE;
  device->max_channels = 16;
  device->default_rate = 48000;
  device->min_rate = 4000;
  device->max_rate = 192000;
  device->latency_lo = 480;
  device->latency_hi = 9600;
  collection->device = device;
  collection->count = 1;
  return CUBEB_OK;
}